

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O2

string * __thiscall
SchemaConverter::_build_object_rule
          (string *__return_storage_ptr__,SchemaConverter *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
          *properties,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,string *name,json *additional_properties)

{
  pointer ppVar1;
  bool bVar2;
  value_t vVar3;
  mapped_type *pmVar4;
  const_iterator cVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer __rhs;
  long lVar8;
  size_t i;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string key_rule;
  string kv_rule;
  string value_rule;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optional_props;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  required_props;
  string prop_rule_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prop_names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_b8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prop_kv_rule_names;
  string_t local_70;
  string local_50;
  
  required_props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optional_props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  required_props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  required_props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  optional_props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  optional_props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  prop_kv_rule_names._M_h._M_buckets = &prop_kv_rule_names._M_h._M_single_bucket;
  prop_kv_rule_names._M_h._M_bucket_count = 1;
  prop_kv_rule_names._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  prop_kv_rule_names._M_h._M_element_count = 0;
  prop_kv_rule_names._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  prop_kv_rule_names._M_h._M_rehash_policy._M_next_resize = 0;
  prop_kv_rule_names._M_h._M_single_bucket = (__node_base_ptr)0x0;
  prop_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  prop_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  prop_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (properties->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs = (properties->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __rhs != ppVar1; __rhs = __rhs + 1) {
    pcVar7 = "-";
    if (name->_M_string_length == 0) {
      pcVar7 = "";
    }
    std::operator+(&key_rule,name,pcVar7);
    std::operator+(&value_rule,&key_rule,&__rhs->first);
    visit(&prop_rule_name,this,&__rhs->second,&value_rule);
    std::__cxx11::string::~string((string *)&value_rule);
    std::__cxx11::string::~string((string *)&key_rule);
    pcVar7 = "-";
    if (name->_M_string_length == 0) {
      pcVar7 = "";
    }
    std::operator+(&local_218,name,pcVar7);
    std::operator+(&kv_rule,&local_218,&__rhs->first);
    std::operator+(&key_rule,&kv_rule,"-kv");
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::
    basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_b8,&__rhs->first);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::dump(&local_70,&local_b8,-1,' ',false,strict);
    format_literal(&local_50,&local_70);
    std::operator+(&local_d8,&local_50," space \":\" space ");
    std::operator+(&local_128,&local_d8,&prop_rule_name);
    _add_rule(&value_rule,this,&key_rule,&local_128);
    pmVar4 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&prop_kv_rule_names,&__rhs->first);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&value_rule);
    std::__cxx11::string::~string((string *)&value_rule);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::~basic_json(&local_b8);
    std::__cxx11::string::~string((string *)&key_rule);
    std::__cxx11::string::~string((string *)&kv_rule);
    std::__cxx11::string::~string((string *)&local_218);
    cVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&required->_M_h,&__rhs->first);
    this_00 = &required_props;
    if (cVar5.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      this_00 = &optional_props;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&__rhs->first);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&prop_names,&__rhs->first);
    std::__cxx11::string::~string((string *)&prop_rule_name);
  }
  vVar3 = (additional_properties->m_data).m_type;
  if (vVar3 == boolean) {
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::get_impl<bool,_0>(additional_properties);
    if (!bVar2) {
      vVar3 = (additional_properties->m_data).m_type;
      goto LAB_001c2b9d;
    }
  }
  else {
LAB_001c2b9d:
    if (vVar3 != object) goto LAB_001c2e98;
  }
  pcVar7 = "-";
  if (name->_M_string_length == 0) {
    pcVar7 = "";
  }
  std::operator+(&value_rule,name,pcVar7);
  std::operator+(&prop_rule_name,&value_rule,"additional");
  std::__cxx11::string::~string((string *)&value_rule);
  if ((additional_properties->m_data).m_type == object) {
    std::operator+(&key_rule,&prop_rule_name,"-value");
    visit(&value_rule,this,additional_properties,&key_rule);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&key_rule,"value",(allocator<char> *)&local_218);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kv_rule,"value",(allocator<char> *)&local_128);
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&PRIMITIVE_RULES_abi_cxx11_,&kv_rule);
    _add_primitive(&value_rule,this,&key_rule,pmVar6);
    std::__cxx11::string::~string((string *)&kv_rule);
  }
  std::__cxx11::string::~string((string *)&key_rule);
  if (prop_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      prop_names.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&kv_rule,"string",(allocator<char> *)&local_128);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_218,"string",(allocator<char> *)&local_d8);
    pmVar6 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&PRIMITIVE_RULES_abi_cxx11_,&local_218);
    _add_primitive(&key_rule,this,&kv_rule,pmVar6);
  }
  else {
    std::operator+(&kv_rule,&prop_rule_name,"-k");
    _not_strings(&local_218,this,&prop_names);
    _add_rule(&key_rule,this,&kv_rule,&local_218);
  }
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&kv_rule);
  std::operator+(&local_218,&prop_rule_name,"-kv");
  std::operator+(&local_d8,&key_rule," \":\" space ");
  std::operator+(&local_128,&local_d8,&value_rule);
  _add_rule(&kv_rule,this,&local_218,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"*",(allocator<char> *)&local_128);
  pmVar4 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&prop_kv_rule_names,&local_218);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"*",(allocator<char> *)&local_128);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&optional_props,
             &local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&kv_rule);
  std::__cxx11::string::~string((string *)&key_rule);
  std::__cxx11::string::~string((string *)&value_rule);
  std::__cxx11::string::~string((string *)&prop_rule_name);
LAB_001c2e98:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"\"{\" space ",(allocator<char> *)&prop_rule_name);
  lVar8 = 0;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)required_props.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)required_props.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
    if (uVar9 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__detail::
    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)&prop_kv_rule_names,
                 (key_type *)
                 ((long)&((required_props.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8));
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    lVar8 = lVar8 + 0x20;
  }
  if (optional_props.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      optional_props.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (required_props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        required_props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    value_rule._M_dataplus._M_p = (pointer)&prop_kv_rule_names;
    value_rule._M_string_length = (size_type)this;
    value_rule.field_2._M_allocated_capacity = (size_type)name;
    value_rule.field_2._8_8_ = &prop_rule_name;
    std::
    function<std::__cxx11::string(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)>
    ::
    function<SchemaConverter::_build_object_rule(std::vector<std::pair<std::__cxx11::string,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>,std::allocator<std::pair<std::__cxx11::string,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>>>const&,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const&)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)_1_,void>
              ((function<std::__cxx11::string(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)>
                *)&prop_rule_name,(anon_class_32_4_64848add *)&value_rule);
    lVar8 = 0;
    uVar9 = 0;
    while( true ) {
      if ((ulong)((long)optional_props.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)optional_props.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar9) break;
      if (uVar9 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&key_rule,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((optional_props.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8),
                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )optional_props.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&kv_rule);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_bool)>
      ::operator()(&value_rule,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_bool)>
                    *)&prop_rule_name,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&key_rule,false);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&value_rule);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&key_rule);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    }
    if (required_props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        required_props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::_Function_base::~_Function_base((_Function_base *)&prop_rule_name);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&prop_names);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&prop_kv_rule_names._M_h);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&optional_props);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&required_props);
  return __return_storage_ptr__;
}

Assistant:

std::string _build_object_rule(
        const std::vector<std::pair<std::string, json>> & properties,
        const std::unordered_set<std::string> & required,
        const std::string & name,
        const json & additional_properties)
    {
        std::vector<std::string> required_props;
        std::vector<std::string> optional_props;
        std::unordered_map<std::string, std::string> prop_kv_rule_names;
        std::vector<std::string> prop_names;
        for (const auto & kv : properties) {
            const auto &prop_name = kv.first;
            const auto &prop_schema = kv.second;

            std::string prop_rule_name = visit(prop_schema, name + (name.empty() ? "" : "-") + prop_name);
            prop_kv_rule_names[prop_name] = _add_rule(
                name + (name.empty() ? "" : "-") + prop_name + "-kv",
                format_literal(json(prop_name).dump()) + " space \":\" space " + prop_rule_name
            );
            if (required.find(prop_name) != required.end()) {
                required_props.push_back(prop_name);
            } else {
                optional_props.push_back(prop_name);
            }
            prop_names.push_back(prop_name);
        }
        if ((additional_properties.is_boolean() && additional_properties.get<bool>()) || additional_properties.is_object()) {
            std::string sub_name = name + (name.empty() ? "" : "-") + "additional";
            std::string value_rule =
                additional_properties.is_object() ? visit(additional_properties, sub_name + "-value")
                : _add_primitive("value", PRIMITIVE_RULES.at("value"));

            auto key_rule =
                prop_names.empty() ? _add_primitive("string", PRIMITIVE_RULES.at("string"))
                : _add_rule(sub_name + "-k", _not_strings(prop_names));
            std::string kv_rule = _add_rule(sub_name + "-kv", key_rule + " \":\" space " + value_rule);
            prop_kv_rule_names["*"] = kv_rule;
            optional_props.push_back("*");
        }

        std::string rule = "\"{\" space ";
        for (size_t i = 0; i < required_props.size(); i++) {
            if (i > 0) {
                rule += " \",\" space ";
            }
            rule += prop_kv_rule_names[required_props[i]];
        }

        if (!optional_props.empty()) {
            rule += " (";
            if (!required_props.empty()) {
                rule += " \",\" space ( ";
            }

            std::function<std::string(const std::vector<std::string> &, bool)> get_recursive_refs = [&](const std::vector<std::string> & ks, bool first_is_optional) {
                std::string res;
                if (ks.empty()) {
                    return res;
                }
                std::string k = ks[0];
                std::string kv_rule_name = prop_kv_rule_names[k];
                std::string comma_ref = "( \",\" space " + kv_rule_name + " )";
                if (first_is_optional) {
                    res = comma_ref + (k == "*" ? "*" : "?");
                } else {
                    res = kv_rule_name + (k == "*" ? " " + comma_ref + "*" : "");
                }
                if (ks.size() > 1) {
                    res += " " + _add_rule(
                        name + (name.empty() ? "" : "-") + k + "-rest",
                        get_recursive_refs(std::vector<std::string>(ks.begin() + 1, ks.end()), true)
                    );
                }
                return res;
            };

            for (size_t i = 0; i < optional_props.size(); i++) {
                if (i > 0) {
                    rule += " | ";
                }
                rule += get_recursive_refs(std::vector<std::string>(optional_props.begin() + i, optional_props.end()), false);
            }
            if (!required_props.empty()) {
                rule += " )";
            }
            rule += " )?";
        }

        rule += " \"}\" space";

        return rule;
    }